

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::swap(CImg<unsigned_char> *this,CImg<unsigned_char> *img)

{
  CImg<unsigned_char> *in_RSI;
  uint *in_RDI;
  
  cimg::swap<unsigned_int>(in_RDI,&in_RSI->_width);
  cimg::swap<unsigned_int>(in_RDI + 1,&in_RSI->_height);
  cimg::swap<unsigned_int>(in_RDI + 2,&in_RSI->_depth);
  cimg::swap<unsigned_int>(in_RDI + 3,&in_RSI->_spectrum);
  cimg::swap<unsigned_char*>((uchar **)(in_RDI + 6),&in_RSI->_data);
  cimg::swap<bool>((bool *)(in_RDI + 4),&in_RSI->_is_shared);
  return in_RSI;
}

Assistant:

CImg<T>& swap(CImg<T>& img) {
      cimg::swap(_width,img._width);
      cimg::swap(_height,img._height);
      cimg::swap(_depth,img._depth);
      cimg::swap(_spectrum,img._spectrum);
      cimg::swap(_data,img._data);
      cimg::swap(_is_shared,img._is_shared);
      return img;
    }